

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack4.h
# Opt level: O3

void ncnn::convdw5x5s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  float *pfVar48;
  float *pfVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar58;
  uint uVar59;
  void *pvVar60;
  void *pvVar61;
  void *pvVar62;
  uint uVar63;
  void *pvVar64;
  int iVar65;
  long lVar66;
  int iVar67;
  void *pvVar68;
  long lVar69;
  void *pvVar70;
  long lVar71;
  void *pvVar72;
  void *pvVar73;
  void *pvVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  
  iVar57 = bottom_blob->c;
  if (0 < (long)iVar57) {
    iVar58 = top_blob->w;
    uVar59 = top_blob->h;
    lVar6 = (long)bottom_blob->w * 4 + 0x10;
    lVar69 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar75 = 0.0;
        fVar76 = 0.0;
        fVar77 = 0.0;
        fVar78 = 0.0;
      }
      else {
        ppvVar1 = &_bias->data + lVar69 * 2;
        fVar75 = *(float *)ppvVar1;
        fVar76 = *(float *)((long)ppvVar1 + 4);
        fVar77 = *(float *)(ppvVar1 + 1);
        fVar78 = *(float *)((long)ppvVar1 + 0xc);
      }
      pvVar74 = (void *)(top_blob->cstep * lVar69 * top_blob->elemsize + (long)top_blob->data);
      lVar71 = kernel->w * lVar69 * kernel->elemsize;
      pvVar72 = (void *)(bottom_blob->cstep * lVar69 * bottom_blob->elemsize +
                        (long)bottom_blob->data);
      lVar66 = (long)bottom_blob->w * bottom_blob->elemsize;
      pvVar62 = (void *)(lVar66 + (long)pvVar72);
      pvVar61 = (void *)(lVar66 * 3 + (long)pvVar72);
      pvVar60 = kernel->data;
      pvVar73 = (void *)(lVar66 * 2 + (long)pvVar72);
      pvVar68 = (void *)(lVar66 * 4 + (long)pvVar72);
      uVar63 = 0;
      if (1 < (int)uVar59) {
        pvVar64 = (void *)(lVar66 * 5 + (long)pvVar72);
        pvVar70 = (void *)(top_blob->elemsize * (long)top_blob->w + (long)pvVar74);
        iVar65 = 0;
        do {
          if (0 < iVar58) {
            lVar66 = 0;
            iVar67 = iVar58;
            do {
              pfVar2 = (float *)((long)pvVar60 + lVar71);
              pfVar7 = (float *)((long)pvVar60 + lVar71 + 0x10);
              pfVar8 = (float *)((long)pvVar60 + lVar71 + 0x20);
              pfVar9 = (float *)((long)pvVar60 + lVar71 + 0x30);
              pfVar10 = (float *)((long)pvVar60 + lVar71 + 0x40);
              pfVar30 = (float *)((long)pvVar72 + lVar66);
              pfVar11 = (float *)((long)pvVar72 + lVar66 + 0x10);
              pfVar12 = (float *)((long)pvVar72 + lVar66 + 0x20);
              pfVar13 = (float *)((long)pvVar72 + lVar66 + 0x30);
              pfVar14 = (float *)((long)pvVar72 + lVar66 + 0x40);
              pfVar31 = (float *)((long)pvVar62 + lVar66);
              pfVar15 = (float *)((long)pvVar62 + lVar66 + 0x10);
              pfVar16 = (float *)((long)pvVar62 + lVar66 + 0x20);
              pfVar17 = (float *)((long)pvVar62 + lVar66 + 0x30);
              pfVar18 = (float *)((long)pvVar62 + lVar66 + 0x40);
              pfVar19 = (float *)((long)pvVar60 + lVar71 + 0x50);
              pfVar20 = (float *)((long)pvVar60 + lVar71 + 0x60);
              pfVar21 = (float *)((long)pvVar60 + lVar71 + 0x70);
              pfVar32 = (float *)((long)pvVar60 + lVar71 + 0x80);
              pfVar33 = (float *)((long)pvVar60 + lVar71 + 0x90);
              pfVar3 = (float *)((long)pvVar73 + lVar66);
              pfVar22 = (float *)((long)pvVar73 + lVar66 + 0x10);
              pfVar23 = (float *)((long)pvVar73 + lVar66 + 0x20);
              pfVar24 = (float *)((long)pvVar73 + lVar66 + 0x30);
              pfVar25 = (float *)((long)pvVar73 + lVar66 + 0x40);
              pfVar34 = (float *)((long)pvVar60 + lVar71 + 0xa0);
              pfVar35 = (float *)((long)pvVar60 + lVar71 + 0xb0);
              pfVar36 = (float *)((long)pvVar60 + lVar71 + 0xc0);
              pfVar37 = (float *)((long)pvVar60 + lVar71 + 0xd0);
              pfVar38 = (float *)((long)pvVar60 + lVar71 + 0xe0);
              pfVar4 = (float *)((long)pvVar61 + lVar66);
              pfVar26 = (float *)((long)pvVar61 + lVar66 + 0x10);
              pfVar27 = (float *)((long)pvVar61 + lVar66 + 0x20);
              pfVar28 = (float *)((long)pvVar61 + lVar66 + 0x30);
              pfVar29 = (float *)((long)pvVar61 + lVar66 + 0x40);
              pfVar39 = (float *)((long)pvVar60 + lVar71 + 0xf0);
              pfVar40 = (float *)((long)pvVar60 + lVar71 + 0x100);
              pfVar41 = (float *)((long)pvVar60 + lVar71 + 0x110);
              pfVar42 = (float *)((long)pvVar60 + lVar71 + 0x120);
              pfVar43 = (float *)((long)pvVar60 + lVar71 + 0x130);
              pfVar5 = (float *)((long)pvVar68 + lVar66);
              auVar50 = *(undefined1 (*) [16])((long)pvVar68 + lVar66 + 0x10);
              auVar51 = *(undefined1 (*) [16])((long)pvVar68 + lVar66 + 0x20);
              auVar52 = *(undefined1 (*) [16])((long)pvVar68 + lVar66 + 0x30);
              auVar80 = *(undefined1 (*) [16])((long)pvVar68 + lVar66 + 0x40);
              pfVar44 = (float *)((long)pvVar60 + lVar71 + 0x140);
              auVar53 = *(undefined1 (*) [16])((long)pvVar60 + lVar71 + 0x150);
              auVar54 = *(undefined1 (*) [16])((long)pvVar60 + lVar71 + 0x160);
              auVar55 = *(undefined1 (*) [16])((long)pvVar60 + lVar71 + 0x170);
              auVar56 = *(undefined1 (*) [16])((long)pvVar60 + lVar71 + 0x180);
              auVar79._0_4_ =
                   *pfVar2 * *pfVar30 + fVar75 + *pfVar8 * *pfVar12 + *pfVar7 * *pfVar11 +
                   *pfVar31 * *pfVar19 + *pfVar9 * *pfVar13 + *pfVar10 * *pfVar14 +
                   *pfVar33 * *pfVar18 +
                   *pfVar32 * *pfVar17 + *pfVar16 * *pfVar21 + *pfVar15 * *pfVar20 +
                   *pfVar34 * *pfVar3 + *pfVar22 * *pfVar35 + *pfVar23 * *pfVar36 +
                   *pfVar37 * *pfVar24 + *pfVar38 * *pfVar25 +
                   *pfVar39 * *pfVar4 + *pfVar40 * *pfVar26 + *pfVar27 * *pfVar41 +
                   *pfVar42 * *pfVar28 + *pfVar43 * *pfVar29 + *pfVar44 * *pfVar5 +
                   auVar50._0_4_ * auVar53._0_4_ + auVar54._0_4_ * auVar51._0_4_ +
                   auVar55._0_4_ * auVar52._0_4_ + auVar56._0_4_ * auVar80._0_4_;
              auVar79._4_4_ =
                   pfVar2[1] * pfVar30[1] + fVar76 + pfVar8[1] * pfVar12[1] + pfVar7[1] * pfVar11[1]
                   + pfVar31[1] * pfVar19[1] + pfVar9[1] * pfVar13[1] + pfVar10[1] * pfVar14[1] +
                   pfVar33[1] * pfVar18[1] +
                   pfVar32[1] * pfVar17[1] + pfVar16[1] * pfVar21[1] + pfVar15[1] * pfVar20[1] +
                   pfVar34[1] * pfVar3[1] + pfVar22[1] * pfVar35[1] + pfVar23[1] * pfVar36[1] +
                   pfVar37[1] * pfVar24[1] + pfVar38[1] * pfVar25[1] +
                   pfVar39[1] * pfVar4[1] + pfVar40[1] * pfVar26[1] + pfVar27[1] * pfVar41[1] +
                   pfVar42[1] * pfVar28[1] + pfVar43[1] * pfVar29[1] + pfVar44[1] * pfVar5[1] +
                   auVar50._4_4_ * auVar53._4_4_ + auVar54._4_4_ * auVar51._4_4_ +
                   auVar55._4_4_ * auVar52._4_4_ + auVar56._4_4_ * auVar80._4_4_;
              auVar79._8_4_ =
                   pfVar2[2] * pfVar30[2] + fVar77 + pfVar8[2] * pfVar12[2] + pfVar7[2] * pfVar11[2]
                   + pfVar31[2] * pfVar19[2] + pfVar9[2] * pfVar13[2] + pfVar10[2] * pfVar14[2] +
                   pfVar33[2] * pfVar18[2] +
                   pfVar32[2] * pfVar17[2] + pfVar16[2] * pfVar21[2] + pfVar15[2] * pfVar20[2] +
                   pfVar34[2] * pfVar3[2] + pfVar22[2] * pfVar35[2] + pfVar23[2] * pfVar36[2] +
                   pfVar37[2] * pfVar24[2] + pfVar38[2] * pfVar25[2] +
                   pfVar39[2] * pfVar4[2] + pfVar40[2] * pfVar26[2] + pfVar27[2] * pfVar41[2] +
                   pfVar42[2] * pfVar28[2] + pfVar43[2] * pfVar29[2] + pfVar44[2] * pfVar5[2] +
                   auVar50._8_4_ * auVar53._8_4_ + auVar54._8_4_ * auVar51._8_4_ +
                   auVar55._8_4_ * auVar52._8_4_ + auVar56._8_4_ * auVar80._8_4_;
              auVar79._12_4_ =
                   pfVar2[3] * pfVar30[3] + fVar78 + pfVar8[3] * pfVar12[3] + pfVar7[3] * pfVar11[3]
                   + pfVar31[3] * pfVar19[3] + pfVar9[3] * pfVar13[3] + pfVar10[3] * pfVar14[3] +
                   pfVar33[3] * pfVar18[3] +
                   pfVar32[3] * pfVar17[3] + pfVar16[3] * pfVar21[3] + pfVar15[3] * pfVar20[3] +
                   pfVar34[3] * pfVar3[3] + pfVar22[3] * pfVar35[3] + pfVar23[3] * pfVar36[3] +
                   pfVar37[3] * pfVar24[3] + pfVar38[3] * pfVar25[3] +
                   pfVar39[3] * pfVar4[3] + pfVar40[3] * pfVar26[3] + pfVar27[3] * pfVar41[3] +
                   pfVar42[3] * pfVar28[3] + pfVar43[3] * pfVar29[3] + pfVar44[3] * pfVar5[3] +
                   auVar50._12_4_ * auVar53._12_4_ + auVar54._12_4_ * auVar51._12_4_ +
                   auVar55._12_4_ * auVar52._12_4_ + auVar56._12_4_ * auVar80._12_4_;
              pfVar11 = (float *)((long)pvVar64 + lVar66);
              pfVar12 = (float *)((long)pvVar64 + lVar66 + 0x10);
              pfVar13 = (float *)((long)pvVar64 + lVar66 + 0x20);
              pfVar14 = (float *)((long)pvVar64 + lVar66 + 0x30);
              pfVar30 = (float *)((long)pvVar64 + lVar66 + 0x40);
              auVar81._0_4_ =
                   *pfVar31 * *pfVar2 + fVar75 + *pfVar15 * *pfVar7 + *pfVar16 * *pfVar8 +
                   *pfVar17 * *pfVar9 + *pfVar18 * *pfVar10 + *pfVar3 * *pfVar19 +
                   *pfVar22 * *pfVar20 + *pfVar23 * *pfVar21 + *pfVar24 * *pfVar32 +
                   *pfVar25 * *pfVar33 +
                   *pfVar4 * *pfVar34 + *pfVar26 * *pfVar35 + *pfVar27 * *pfVar36 +
                   *pfVar28 * *pfVar37 + *pfVar29 * *pfVar38 +
                   *pfVar5 * *pfVar39 + auVar50._0_4_ * *pfVar40 + auVar51._0_4_ * *pfVar41 +
                   auVar52._0_4_ * *pfVar42 + auVar80._0_4_ * *pfVar43 + *pfVar44 * *pfVar11 +
                   auVar53._0_4_ * *pfVar12 + auVar54._0_4_ * *pfVar13 + auVar55._0_4_ * *pfVar14 +
                   auVar56._0_4_ * *pfVar30;
              auVar81._4_4_ =
                   pfVar31[1] * pfVar2[1] + fVar76 + pfVar15[1] * pfVar7[1] + pfVar16[1] * pfVar8[1]
                   + pfVar17[1] * pfVar9[1] + pfVar18[1] * pfVar10[1] + pfVar3[1] * pfVar19[1] +
                   pfVar22[1] * pfVar20[1] + pfVar23[1] * pfVar21[1] + pfVar24[1] * pfVar32[1] +
                   pfVar25[1] * pfVar33[1] +
                   pfVar4[1] * pfVar34[1] + pfVar26[1] * pfVar35[1] + pfVar27[1] * pfVar36[1] +
                   pfVar28[1] * pfVar37[1] + pfVar29[1] * pfVar38[1] +
                   pfVar5[1] * pfVar39[1] + auVar50._4_4_ * pfVar40[1] + auVar51._4_4_ * pfVar41[1]
                   + auVar52._4_4_ * pfVar42[1] + auVar80._4_4_ * pfVar43[1] +
                   pfVar44[1] * pfVar11[1] +
                   auVar53._4_4_ * pfVar12[1] + auVar54._4_4_ * pfVar13[1] +
                   auVar55._4_4_ * pfVar14[1] + auVar56._4_4_ * pfVar30[1];
              auVar81._8_4_ =
                   pfVar31[2] * pfVar2[2] + fVar77 + pfVar15[2] * pfVar7[2] + pfVar16[2] * pfVar8[2]
                   + pfVar17[2] * pfVar9[2] + pfVar18[2] * pfVar10[2] + pfVar3[2] * pfVar19[2] +
                   pfVar22[2] * pfVar20[2] + pfVar23[2] * pfVar21[2] + pfVar24[2] * pfVar32[2] +
                   pfVar25[2] * pfVar33[2] +
                   pfVar4[2] * pfVar34[2] + pfVar26[2] * pfVar35[2] + pfVar27[2] * pfVar36[2] +
                   pfVar28[2] * pfVar37[2] + pfVar29[2] * pfVar38[2] +
                   pfVar5[2] * pfVar39[2] + auVar50._8_4_ * pfVar40[2] + auVar51._8_4_ * pfVar41[2]
                   + auVar52._8_4_ * pfVar42[2] + auVar80._8_4_ * pfVar43[2] +
                   pfVar44[2] * pfVar11[2] +
                   auVar53._8_4_ * pfVar12[2] + auVar54._8_4_ * pfVar13[2] +
                   auVar55._8_4_ * pfVar14[2] + auVar56._8_4_ * pfVar30[2];
              auVar81._12_4_ =
                   pfVar31[3] * pfVar2[3] + fVar78 + pfVar15[3] * pfVar7[3] + pfVar16[3] * pfVar8[3]
                   + pfVar17[3] * pfVar9[3] + pfVar18[3] * pfVar10[3] + pfVar3[3] * pfVar19[3] +
                   pfVar22[3] * pfVar20[3] + pfVar23[3] * pfVar21[3] + pfVar24[3] * pfVar32[3] +
                   pfVar25[3] * pfVar33[3] +
                   pfVar4[3] * pfVar34[3] + pfVar26[3] * pfVar35[3] + pfVar27[3] * pfVar36[3] +
                   pfVar28[3] * pfVar37[3] + pfVar29[3] * pfVar38[3] +
                   pfVar5[3] * pfVar39[3] + auVar50._12_4_ * pfVar40[3] +
                   auVar51._12_4_ * pfVar41[3] + auVar52._12_4_ * pfVar42[3] +
                   auVar80._12_4_ * pfVar43[3] + pfVar44[3] * pfVar11[3] +
                   auVar53._12_4_ * pfVar12[3] + auVar54._12_4_ * pfVar13[3] +
                   auVar55._12_4_ * pfVar14[3] + auVar56._12_4_ * pfVar30[3];
              *(undefined1 (*) [16])((long)pvVar74 + lVar66) = auVar79;
              *(undefined1 (*) [16])((long)pvVar70 + lVar66) = auVar81;
              lVar66 = lVar66 + 0x10;
              iVar67 = iVar67 + -1;
            } while (iVar67 != 0);
            pvVar64 = (void *)((long)pvVar64 + lVar66);
            pvVar68 = (void *)((long)pvVar68 + lVar66);
            pvVar61 = (void *)((long)pvVar61 + lVar66);
            pvVar73 = (void *)((long)pvVar73 + lVar66);
            pvVar62 = (void *)((long)pvVar62 + lVar66);
            pvVar72 = (void *)((long)pvVar72 + lVar66);
            pvVar70 = (void *)((long)pvVar70 + lVar66);
            pvVar74 = (void *)((long)pvVar74 + lVar66);
          }
          pvVar72 = (void *)((long)pvVar72 + lVar6 * 4);
          pvVar62 = (void *)((long)pvVar62 + lVar6 * 4);
          pvVar73 = (void *)((long)pvVar73 + lVar6 * 4);
          pvVar61 = (void *)((long)pvVar61 + lVar6 * 4);
          pvVar68 = (void *)((long)pvVar68 + lVar6 * 4);
          pvVar64 = (void *)((long)pvVar64 + lVar6 * 4);
          pvVar74 = (void *)((long)pvVar74 + (long)iVar58 * 0x10);
          pvVar70 = (void *)((long)pvVar70 + (long)iVar58 * 0x10);
          iVar67 = iVar65 + 3;
          iVar65 = iVar65 + 2;
          uVar63 = uVar59 & 0xfffffffe;
        } while (iVar67 < (int)uVar59);
      }
      if ((int)uVar63 < (int)uVar59) {
        do {
          if (0 < iVar58) {
            lVar66 = 0;
            iVar65 = iVar58;
            do {
              pfVar2 = (float *)((long)pvVar60 + lVar71);
              pfVar11 = (float *)((long)pvVar60 + lVar71 + 0x10);
              pfVar7 = (float *)((long)pvVar60 + lVar71 + 0x20);
              pfVar8 = (float *)((long)pvVar60 + lVar71 + 0x30);
              pfVar9 = (float *)((long)pvVar60 + lVar71 + 0x40);
              pfVar34 = (float *)((long)pvVar72 + lVar66);
              pfVar10 = (float *)((long)pvVar72 + lVar66 + 0x10);
              pfVar12 = (float *)((long)pvVar72 + lVar66 + 0x20);
              pfVar13 = (float *)((long)pvVar72 + lVar66 + 0x30);
              pfVar14 = (float *)((long)pvVar72 + lVar66 + 0x40);
              pfVar15 = (float *)((long)pvVar60 + lVar71 + 0x50);
              pfVar16 = (float *)((long)pvVar60 + lVar71 + 0x60);
              pfVar17 = (float *)((long)pvVar60 + lVar71 + 0x70);
              pfVar36 = (float *)((long)pvVar60 + lVar71 + 0x80);
              pfVar37 = (float *)((long)pvVar60 + lVar71 + 0x90);
              pfVar35 = (float *)((long)pvVar62 + lVar66);
              pfVar18 = (float *)((long)pvVar62 + lVar66 + 0x10);
              pfVar19 = (float *)((long)pvVar62 + lVar66 + 0x20);
              pfVar20 = (float *)((long)pvVar62 + lVar66 + 0x30);
              pfVar21 = (float *)((long)pvVar62 + lVar66 + 0x40);
              pfVar38 = (float *)((long)pvVar60 + lVar71 + 0xa0);
              pfVar39 = (float *)((long)pvVar60 + lVar71 + 0xb0);
              pfVar40 = (float *)((long)pvVar60 + lVar71 + 0xc0);
              pfVar41 = (float *)((long)pvVar60 + lVar71 + 0xd0);
              pfVar42 = (float *)((long)pvVar60 + lVar71 + 0xe0);
              pfVar3 = (float *)((long)pvVar73 + lVar66);
              pfVar22 = (float *)((long)pvVar73 + lVar66 + 0x10);
              pfVar23 = (float *)((long)pvVar73 + lVar66 + 0x20);
              pfVar24 = (float *)((long)pvVar73 + lVar66 + 0x30);
              pfVar25 = (float *)((long)pvVar73 + lVar66 + 0x40);
              pfVar43 = (float *)((long)pvVar60 + lVar71 + 0xf0);
              pfVar44 = (float *)((long)pvVar60 + lVar71 + 0x100);
              pfVar45 = (float *)((long)pvVar60 + lVar71 + 0x110);
              pfVar46 = (float *)((long)pvVar60 + lVar71 + 0x120);
              pfVar47 = (float *)((long)pvVar60 + lVar71 + 0x130);
              pfVar4 = (float *)((long)pvVar61 + lVar66);
              pfVar26 = (float *)((long)pvVar61 + lVar66 + 0x10);
              pfVar27 = (float *)((long)pvVar61 + lVar66 + 0x20);
              pfVar28 = (float *)((long)pvVar61 + lVar66 + 0x30);
              pfVar29 = (float *)((long)pvVar61 + lVar66 + 0x40);
              pfVar48 = (float *)((long)pvVar60 + lVar71 + 0x140);
              pfVar49 = (float *)((long)pvVar60 + lVar71 + 0x150);
              auVar50 = *(undefined1 (*) [16])((long)pvVar60 + lVar71 + 0x160);
              auVar51 = *(undefined1 (*) [16])((long)pvVar60 + lVar71 + 0x170);
              auVar52 = *(undefined1 (*) [16])((long)pvVar60 + lVar71 + 0x180);
              pfVar5 = (float *)((long)pvVar68 + lVar66);
              pfVar30 = (float *)((long)pvVar68 + lVar66 + 0x10);
              pfVar31 = (float *)((long)pvVar68 + lVar66 + 0x20);
              pfVar32 = (float *)((long)pvVar68 + lVar66 + 0x30);
              pfVar33 = (float *)((long)pvVar68 + lVar66 + 0x40);
              auVar80._0_4_ =
                   *pfVar2 * *pfVar34 + fVar75 + *pfVar11 * *pfVar10 + *pfVar7 * *pfVar12 +
                   *pfVar8 * *pfVar13 + *pfVar9 * *pfVar14 + *pfVar15 * *pfVar35 +
                   *pfVar16 * *pfVar18 + *pfVar17 * *pfVar19 + *pfVar36 * *pfVar20 +
                   *pfVar37 * *pfVar21 +
                   *pfVar38 * *pfVar3 + *pfVar39 * *pfVar22 + *pfVar40 * *pfVar23 +
                   *pfVar41 * *pfVar24 + *pfVar42 * *pfVar25 +
                   *pfVar43 * *pfVar4 + *pfVar44 * *pfVar26 + *pfVar45 * *pfVar27 +
                   *pfVar46 * *pfVar28 + *pfVar47 * *pfVar29 + *pfVar48 * *pfVar5 +
                   *pfVar49 * *pfVar30 + auVar50._0_4_ * *pfVar31 + auVar51._0_4_ * *pfVar32 +
                   auVar52._0_4_ * *pfVar33;
              auVar80._4_4_ =
                   pfVar2[1] * pfVar34[1] + fVar76 +
                   pfVar11[1] * pfVar10[1] + pfVar7[1] * pfVar12[1] +
                   pfVar8[1] * pfVar13[1] + pfVar9[1] * pfVar14[1] + pfVar15[1] * pfVar35[1] +
                   pfVar16[1] * pfVar18[1] + pfVar17[1] * pfVar19[1] + pfVar36[1] * pfVar20[1] +
                   pfVar37[1] * pfVar21[1] +
                   pfVar38[1] * pfVar3[1] + pfVar39[1] * pfVar22[1] + pfVar40[1] * pfVar23[1] +
                   pfVar41[1] * pfVar24[1] + pfVar42[1] * pfVar25[1] +
                   pfVar43[1] * pfVar4[1] + pfVar44[1] * pfVar26[1] + pfVar45[1] * pfVar27[1] +
                   pfVar46[1] * pfVar28[1] + pfVar47[1] * pfVar29[1] + pfVar48[1] * pfVar5[1] +
                   pfVar49[1] * pfVar30[1] + auVar50._4_4_ * pfVar31[1] + auVar51._4_4_ * pfVar32[1]
                   + auVar52._4_4_ * pfVar33[1];
              auVar80._8_4_ =
                   pfVar2[2] * pfVar34[2] + fVar77 +
                   pfVar11[2] * pfVar10[2] + pfVar7[2] * pfVar12[2] +
                   pfVar8[2] * pfVar13[2] + pfVar9[2] * pfVar14[2] + pfVar15[2] * pfVar35[2] +
                   pfVar16[2] * pfVar18[2] + pfVar17[2] * pfVar19[2] + pfVar36[2] * pfVar20[2] +
                   pfVar37[2] * pfVar21[2] +
                   pfVar38[2] * pfVar3[2] + pfVar39[2] * pfVar22[2] + pfVar40[2] * pfVar23[2] +
                   pfVar41[2] * pfVar24[2] + pfVar42[2] * pfVar25[2] +
                   pfVar43[2] * pfVar4[2] + pfVar44[2] * pfVar26[2] + pfVar45[2] * pfVar27[2] +
                   pfVar46[2] * pfVar28[2] + pfVar47[2] * pfVar29[2] + pfVar48[2] * pfVar5[2] +
                   pfVar49[2] * pfVar30[2] + auVar50._8_4_ * pfVar31[2] + auVar51._8_4_ * pfVar32[2]
                   + auVar52._8_4_ * pfVar33[2];
              auVar80._12_4_ =
                   pfVar2[3] * pfVar34[3] + fVar78 +
                   pfVar11[3] * pfVar10[3] + pfVar7[3] * pfVar12[3] +
                   pfVar8[3] * pfVar13[3] + pfVar9[3] * pfVar14[3] + pfVar15[3] * pfVar35[3] +
                   pfVar16[3] * pfVar18[3] + pfVar17[3] * pfVar19[3] + pfVar36[3] * pfVar20[3] +
                   pfVar37[3] * pfVar21[3] +
                   pfVar38[3] * pfVar3[3] + pfVar39[3] * pfVar22[3] + pfVar40[3] * pfVar23[3] +
                   pfVar41[3] * pfVar24[3] + pfVar42[3] * pfVar25[3] +
                   pfVar43[3] * pfVar4[3] + pfVar44[3] * pfVar26[3] + pfVar45[3] * pfVar27[3] +
                   pfVar46[3] * pfVar28[3] + pfVar47[3] * pfVar29[3] + pfVar48[3] * pfVar5[3] +
                   pfVar49[3] * pfVar30[3] + auVar50._12_4_ * pfVar31[3] +
                   auVar51._12_4_ * pfVar32[3] + auVar52._12_4_ * pfVar33[3];
              *(undefined1 (*) [16])((long)pvVar74 + lVar66) = auVar80;
              lVar66 = lVar66 + 0x10;
              iVar65 = iVar65 + -1;
            } while (iVar65 != 0);
            pvVar68 = (void *)((long)pvVar68 + lVar66);
            pvVar61 = (void *)((long)pvVar61 + lVar66);
            pvVar73 = (void *)((long)pvVar73 + lVar66);
            pvVar62 = (void *)((long)pvVar62 + lVar66);
            pvVar72 = (void *)((long)pvVar72 + lVar66);
            pvVar74 = (void *)((long)pvVar74 + lVar66);
          }
          pvVar72 = (void *)((long)pvVar72 + 0x40);
          pvVar62 = (void *)((long)pvVar62 + 0x40);
          pvVar73 = (void *)((long)pvVar73 + 0x40);
          pvVar61 = (void *)((long)pvVar61 + 0x40);
          pvVar68 = (void *)((long)pvVar68 + 0x40);
          uVar63 = uVar63 + 1;
        } while (uVar63 != uVar59);
      }
      lVar69 = lVar69 + 1;
    } while (lVar69 != iVar57);
  }
  return;
}

Assistant:

static void convdw5x5s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps(bias + g * 4) : _mm_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);
        const float* r5 = img0.row(5);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;
                __m128 _sum1 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k03, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k04, _r14, _sum1);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k13, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k14, _r24, _sum1);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r32, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k23, _r33, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k24, _r34, _sum1);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k30, _r40, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k31, _r41, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k32, _r42, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k33, _r43, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k34, _r44, _sum1);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                __m128 _r50 = _mm_load_ps(r5);
                __m128 _r51 = _mm_load_ps(r5 + 4);
                __m128 _r52 = _mm_load_ps(r5 + 4 * 2);
                __m128 _r53 = _mm_load_ps(r5 + 4 * 3);
                __m128 _r54 = _mm_load_ps(r5 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k40, _r50, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k41, _r51, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k42, _r52, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k43, _r53, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k44, _r54, _sum1);

                _mm_store_ps(outptr0, _sum0);
                _mm_store_ps(outptr1, _sum1);

                outptr0 += 4;
                outptr1 += 4;

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;
                r5 += 4;
            }

            r0 += 4 * 4 + w * 4;
            r1 += 4 * 4 + w * 4;
            r2 += 4 * 4 + w * 4;
            r3 += 4 * 4 + w * 4;
            r4 += 4 * 4 + w * 4;
            r5 += 4 * 4 + w * 4;

            outptr0 += outw * 4;
            outptr1 += outw * 4;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm_store_ps(outptr0, _sum0);

                outptr0 += 4;

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;
            }

            r0 += 4 * 4;
            r1 += 4 * 4;
            r2 += 4 * 4;
            r3 += 4 * 4;
            r4 += 4 * 4;
        }
    }
}